

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata160.cpp
# Opt level: O1

void __thiscall
ByteData160_PushBack_Test::~ByteData160_PushBack_Test(ByteData160_PushBack_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ByteData160, PushBack) {
  ByteData160 base("1111111111111111111111111111111111111111");
  ByteData data1("2233");
  ByteData160 data2("4444444444444444444444444444444444444444");
  ByteData256 data3("5555555555555555555555555555555555555555555555555555555555555555");
  ByteData result;

  EXPECT_NO_THROW(result = base.PushBack(data1));
  EXPECT_STREQ(result.GetHex().c_str(), "11111111111111111111111111111111111111112233");

  EXPECT_NO_THROW(result = base.PushBack(data2));
  EXPECT_STREQ(result.GetHex().c_str(), "11111111111111111111111111111111111111114444444444444444444444444444444444444444");

  EXPECT_NO_THROW(result = base.PushBack(data3));
  EXPECT_STREQ(result.GetHex().c_str(), "11111111111111111111111111111111111111115555555555555555555555555555555555555555555555555555555555555555");
}